

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

int Saig_ManDemiterNew(Aig_Man_t *pMan)

{
  void *pvVar1;
  uint *puVar2;
  int iVar3;
  Vec_Ptr_t *vSuper;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vSuper->pArray = ppvVar4;
  uVar6 = (ulong)(uint)pMan->nTruePos;
  if (0 < pMan->nTruePos) {
    uVar10 = 0;
    do {
      if ((long)pMan->vCos->nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((pMan->nConstrs != 0) && ((long)((int)uVar6 - pMan->nConstrs) <= (long)uVar10)) break;
      pvVar1 = pMan->vCos->pArray[uVar10];
      printf("Output %3d : ",uVar10 & 0xffffffff);
      uVar6 = *(ulong *)((long)pvVar1 + 8);
      uVar7 = (uint)*(undefined8 *)&((Aig_Obj_t *)(uVar6 & 0xfffffffffffffffe))->field_0x18;
      if ((uVar7 & 7) == 1) {
        if ((uVar6 & 1) == 0) {
          pcVar8 = "Const1";
        }
        else {
          pcVar8 = "Const0";
        }
LAB_006e4067:
        puts(pcVar8);
      }
      else {
        if ((uVar7 & 7) - 7 < 0xfffffffe) {
          pcVar8 = "Terminal";
          goto LAB_006e4067;
        }
        if ((uVar6 & 1) == 0) {
          printf("AND  ");
          iVar3 = Aig_ObjRecognizeExor
                            ((Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                             &local_38,&local_40);
          pcVar8 = " Yes";
          if (iVar3 == 0) {
            pcVar8 = " No";
          }
LAB_006e40ae:
          printf(pcVar8);
        }
        else {
          Aig_ObjCollectSuper((Aig_Obj_t *)(uVar6 & 0xfffffffffffffffe),vSuper);
          printf("OR with %d inputs    ",(ulong)(uint)vSuper->nSize);
          if (vSuper->nSize == 2) {
            iVar3 = Aig_ObjRecognizeExor
                              ((Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                               &local_38,&local_40);
            if (iVar3 == 0) {
              pcVar8 = " No";
              goto LAB_006e40ae;
            }
            printf(" Yes");
            putchar(10);
            pVVar5 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe));
            if (0 < pVVar5->nSize) {
              lVar9 = 0;
              do {
                puVar2 = (uint *)pVVar5->pArray[lVar9];
                if (((puVar2[6] & 7) == 2) && (pMan->nTruePis <= (int)*puVar2)) {
                  printf(" %d",(ulong)*puVar2);
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < pVVar5->nSize);
            }
            putchar(10);
            if (pVVar5->pArray != (void **)0x0) {
              free(pVVar5->pArray);
              pVVar5->pArray = (void **)0x0;
            }
            if (pVVar5 != (Vec_Ptr_t *)0x0) {
              free(pVVar5);
            }
            pVVar5 = Aig_Support(pMan,(Aig_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe));
            if (0 < pVVar5->nSize) {
              lVar9 = 0;
              do {
                puVar2 = (uint *)pVVar5->pArray[lVar9];
                if (((puVar2[6] & 7) == 2) && (pMan->nTruePis <= (int)*puVar2)) {
                  printf(" %d",(ulong)*puVar2);
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < pVVar5->nSize);
            }
            putchar(10);
            if (pVVar5->pArray != (void **)0x0) {
              free(pVVar5->pArray);
              pVVar5->pArray = (void **)0x0;
            }
            if (pVVar5 != (Vec_Ptr_t *)0x0) {
              free(pVVar5);
            }
          }
        }
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      uVar6 = (ulong)pMan->nTruePos;
    } while ((long)uVar10 < (long)uVar6);
  }
  if (vSuper->pArray != (void **)0x0) {
    free(vSuper->pArray);
    vSuper->pArray = (void **)0x0;
  }
  free(vSuper);
  return 1;
}

Assistant:

int Saig_ManDemiterNew( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSuper, * vSupp0, * vSupp1;
    Aig_Obj_t * pObj, * pTemp, * pFan0, * pFan1;
    int i, k;
    vSuper = Vec_PtrAlloc( 100 );
    Saig_ManForEachPo( pMan, pObj, i )
    {
        if ( pMan->nConstrs && i >= Saig_ManPoNum(pMan) - pMan->nConstrs )
            break;
        printf( "Output %3d : ", i );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "Const1\n" );
            else
                printf( "Const0\n" );
            continue;
        }
        if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) )
        {
            printf( "Terminal\n" );
            continue;
        }
        // check AND
        if ( !Aig_ObjFaninC0(pObj) )
        { 
            printf( "AND  " );
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
                printf( " Yes" );
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
        // check OR
        Aig_ObjCollectSuper( Aig_ObjFanin0(pObj), vSuper );
        printf( "OR with %d inputs    ", Vec_PtrSize(vSuper) );
        if ( Vec_PtrSize(vSuper) == 2 )
        {
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                printf( "\n" );

                vSupp0 = Aig_Support( pMan, Aig_Regular(pFan0) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp0, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp0 );

                vSupp1 = Aig_Support( pMan, Aig_Regular(pFan1) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp1, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp1 );
            }
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
/*
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pTemp, k )
            if ( Aig_ObjRecognizeExor(Aig_Regular(pTemp), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                if ( Aig_IsComplement(pTemp) )
                    pFan0 = Aig_Not(pFan0);
            }
            else
                printf( " No" );
*/
        printf( "\n" );
    }
    Vec_PtrFree( vSuper );
    return 1;
}